

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_mtx_alloc(nng_mtx **mpp)

{
  int iVar1;
  nng_mtx *mtx;
  
  mtx = (nng_mtx *)nni_zalloc(0x28);
  if (mtx == (nng_mtx *)0x0) {
    iVar1 = 2;
  }
  else {
    nni_mtx_init((nni_mtx *)mtx);
    *mpp = mtx;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nng_mtx_alloc(nng_mtx **mpp)
{
	nng_mtx *mp;

	if ((mp = NNI_ALLOC_STRUCT(mp)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_mtx_init(&mp->m);
	*mpp = mp;
	return (0);
}